

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_check_extension(nifti_image *nim,int size,int code,int rem)

{
  int iVar1;
  int rem_local;
  int code_local;
  int size_local;
  nifti_image *nim_local;
  
  iVar1 = nifti_is_valid_ecode(code);
  if ((iVar1 == 0) && (2 < g_opts.debug)) {
    fprintf(_stderr,"-d invalid extension code %d\n",(ulong)(uint)code);
  }
  if (size < 0x10) {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d ext size %d, no extension\n",(ulong)(uint)size);
    }
    nim_local._4_4_ = 0;
  }
  else if (rem < size) {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d ext size %d, space %d, no extension\n",(ulong)(uint)size,(ulong)(uint)rem)
      ;
    }
    nim_local._4_4_ = 0;
  }
  else if ((size & 0xfU) == 0) {
    if ((nim->nifti_type == 3) && (100000 < size)) {
      if (2 < g_opts.debug) {
        fprintf(_stderr,"-d NVE, bad nifti_type 3 size %d\n",(ulong)(uint)size);
      }
      nim_local._4_4_ = 0;
    }
    else {
      nim_local._4_4_ = 1;
    }
  }
  else {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d nifti extension size %d not multiple of 16\n",(ulong)(uint)size);
    }
    nim_local._4_4_ = 0;
  }
  return nim_local._4_4_;
}

Assistant:

static int nifti_check_extension(nifti_image *nim, int size, int code, int rem)
{
   /* check for bad code before bad size */
   if( ! nifti_is_valid_ecode(code) ) {
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d invalid extension code %d\n",code);
      /* should not be fatal    29 Apr 2015 [rickr] */
   }

   if( size < 16 ){
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d ext size %d, no extension\n",size);
      return 0;
   }

   if( size > rem ){
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d ext size %d, space %d, no extension\n", size, rem);
      return 0;
   }

   if( size & 0xf ){
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d nifti extension size %d not multiple of 16\n",size);
      return 0;
   }

   if( nim->nifti_type == NIFTI_FTYPE_ASCII && size > LNI_MAX_NIA_EXT_LEN ){
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d NVE, bad nifti_type 3 size %d\n", size);
      return 0;
   }

   return 1;
}